

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O0

PointerType __thiscall cmLinkedTree<cmDefinitions>::iterator::operator->(iterator *this)

{
  ulong uVar1;
  size_type sVar2;
  size_type sVar3;
  cmDefinitions *pcVar4;
  iterator *this_local;
  
  if (this->Tree == (cmLinkedTree<cmDefinitions> *)0x0) {
    __assert_fail("this->Tree",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmLinkedTree.h"
                  ,0x4b,
                  "PointerType cmLinkedTree<cmDefinitions>::iterator::operator->() [T = cmDefinitions]"
                 );
  }
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->Tree->UpPositions)
  ;
  sVar3 = std::vector<cmDefinitions,_std::allocator<cmDefinitions>_>::size(&this->Tree->Data);
  if (sVar2 != sVar3) {
    __assert_fail("this->Tree->UpPositions.size() == this->Tree->Data.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmLinkedTree.h"
                  ,0x4c,
                  "PointerType cmLinkedTree<cmDefinitions>::iterator::operator->() [T = cmDefinitions]"
                 );
  }
  uVar1 = this->Position;
  sVar2 = std::vector<cmDefinitions,_std::allocator<cmDefinitions>_>::size(&this->Tree->Data);
  if (sVar2 < uVar1) {
    __assert_fail("this->Position <= this->Tree->Data.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmLinkedTree.h"
                  ,0x4d,
                  "PointerType cmLinkedTree<cmDefinitions>::iterator::operator->() [T = cmDefinitions]"
                 );
  }
  if (this->Position != 0) {
    pcVar4 = GetPointer(this->Tree,this->Position - 1);
    return pcVar4;
  }
  __assert_fail("this->Position > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmLinkedTree.h"
                ,0x4e,
                "PointerType cmLinkedTree<cmDefinitions>::iterator::operator->() [T = cmDefinitions]"
               );
}

Assistant:

PointerType operator->()
    {
      assert(this->Tree);
      assert(this->Tree->UpPositions.size() == this->Tree->Data.size());
      assert(this->Position <= this->Tree->Data.size());
      assert(this->Position > 0);
      return this->Tree->GetPointer(this->Position - 1);
    }